

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

void __thiscall CVmFormatter::expand_pending_tab(CVmFormatter *this,int allow_anon)

{
  undefined4 uVar1;
  undefined4 uVar2;
  os_color_t oVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  vmcon_color_t *__src;
  
  switch(this->pending_tab_align_) {
  case VMFMT_TAB_NONE:
  case VMFMT_TAB_LEFT:
    goto switchD_00236a27_caseD_0;
  case VMFMT_TAB_CENTER:
    iVar5 = this->pending_tab_start_;
    iVar6 = this->linecol_ - iVar5;
    if (this->pending_tab_entry_ == (CVmFmtTabStop *)0x0) {
      if (allow_anon != 0) {
        iVar5 = (*this->console_->_vptr_CVmConsole[6])();
        uVar7 = (iVar5 - (iVar6 + this->pending_tab_start_)) / 2;
        goto LAB_00236aee;
      }
    }
    else {
      iVar6 = iVar6 / -2 +
              *(int *)&(this->pending_tab_entry_->super_CVmHashEntryCS).super_CVmHashEntry.
                       field_0x24;
      uVar7 = iVar6 - iVar5;
      if (uVar7 != 0 && iVar5 <= iVar6) {
LAB_00236aee:
        if (0 < (int)uVar7) {
          iVar5 = this->linecol_ - this->pending_tab_start_;
          iVar6 = this->linepos_ - iVar5;
          memmove(this->linebuf_ + (long)iVar6 + (ulong)uVar7,this->linebuf_ + iVar6,
                  (long)iVar5 * 4 + 4);
          __src = this->colorbuf_ + iVar6;
          memmove(this->colorbuf_ + (long)iVar6 + (ulong)uVar7,__src,
                  (long)((this->linepos_ - iVar6) + 1) * 0x18);
          uVar1 = this->linepos_;
          uVar2 = this->linecol_;
          this->linepos_ = uVar7 + uVar1;
          this->linecol_ = uVar7 + uVar2;
          for (lVar8 = 0; uVar7 != (uint)lVar8; lVar8 = lVar8 + 1) {
            (this->linebuf_ + iVar6)[lVar8] = L' ';
            uVar4 = *(undefined4 *)&(this->pending_tab_color_).field_0x14;
            __src->attr = (this->pending_tab_color_).attr;
            *(undefined4 *)&__src->field_0x14 = uVar4;
            oVar3 = (this->pending_tab_color_).bg;
            __src->fg = (this->pending_tab_color_).fg;
            __src->bg = oVar3;
            __src = __src + 1;
          }
        }
      }
    }
    break;
  case VMFMT_TAB_RIGHT:
    if (this->pending_tab_entry_ == (CVmFmtTabStop *)0x0) {
      if (allow_anon != 0) {
        iVar5 = (*this->console_->_vptr_CVmConsole[6])();
        uVar7 = ~this->linecol_ + iVar5;
        goto LAB_00236aee;
      }
    }
    else {
      iVar5 = *(int *)&(this->pending_tab_entry_->super_CVmHashEntryCS).super_CVmHashEntry.
                       field_0x24;
      uVar7 = iVar5 - this->linecol_;
      if (uVar7 != 0 && this->linecol_ <= iVar5) goto LAB_00236aee;
    }
    break;
  case VMFMT_TAB_DECIMAL:
    iVar5 = this->pending_tab_start_;
    for (lVar8 = (long)((this->linepos_ + iVar5) - this->linecol_);
        (lVar8 < this->linepos_ && (this->linebuf_[lVar8] != this->pending_tab_dp_));
        lVar8 = lVar8 + 1) {
      iVar5 = iVar5 + 1;
    }
    iVar6 = *(int *)&(this->pending_tab_entry_->super_CVmHashEntryCS).super_CVmHashEntry.field_0x24;
    uVar7 = iVar6 - iVar5;
    if (uVar7 != 0 && iVar5 <= iVar6) goto LAB_00236aee;
  }
  this->pending_tab_align_ = VMFMT_TAB_NONE;
switchD_00236a27_caseD_0:
  return;
}

Assistant:

void CVmFormatter::expand_pending_tab(VMG_ int allow_anon)
{
    int txtlen;
    int spaces;
    int i;
    int col;
    
    /* check the alignment */
    switch(pending_tab_align_)
    {
    case VMFMT_TAB_LEFT:
        /* 
         *   left-aligned tabs are never pending, so this should never
         *   happen 
         */
        assert(FALSE);
        return;

    case VMFMT_TAB_NONE:
        /* there's no pending tab, so there's nothing to do */
        return;

    case VMFMT_TAB_RIGHT:
        /*
         *   It's a right-aligned tab.  If we have a TO, expand the tab with
         *   enough spaces to push the text up to the defined tab's column;
         *   otherwise, insert spaces to push the text to the full line
         *   width.  
         */
        if (pending_tab_entry_ != 0)
        {
            /* 
             *   if we're not past the tab, insert enough spaces to get us
             *   there; if we're already past the tab, insert nothing 
             */
            if (pending_tab_entry_->column_ > linecol_)
                spaces = pending_tab_entry_->column_ - linecol_;
            else
                spaces = 0;
        }
        else if (allow_anon)
        {
            /* push the text to the full line width */
            spaces = console_->get_line_width() - 1 - linecol_;
        }
        else
        {
            /* it's anonymous, but these aren't allowed - ignore it */
            spaces = 0;
        }
        break;

    case VMFMT_TAB_CENTER:
        /*
         *   It's a center-aligned tab.  If we have a TO, expand the tab
         *   with enough spaces to center the text on the defined tab's
         *   column; otherwise, center the text between the tab's starting
         *   column and the full line width. 
         */
        txtlen = linecol_ - pending_tab_start_;
        if (pending_tab_entry_ != 0)
        {
            int startcol;
            
            /* 
             *   find the column where the text would have to start for the
             *   text to be centered over the tab's column 
             */
            startcol = pending_tab_entry_->column_ - (txtlen / 2);

            /* 
             *   if that's past the starting column, insert enough spaces to
             *   get us there; otherwise, do nothing, as we'd have to start
             *   to the left of the leftmost place we can put the text 
             */
            if (startcol > pending_tab_start_)
                spaces = startcol - pending_tab_start_;
            else
                spaces = 0;
        }
        else if (allow_anon)
        {
            /* center the text in the remaining space to the line width */
            spaces = ((console_->get_line_width() - pending_tab_start_)
                      - txtlen) / 2;
        }
        else
        {
            /* it's anonymous, but these aren't allowed - ignore it */
            spaces = 0;
        }
        break;

    case VMFMT_TAB_DECIMAL:
        /*
         *   Decimal tab.  Scan the text after the tab, looking for the
         *   first occurrence of the decimal point character. 
         */
        for (col = pending_tab_start_, i = linepos_ - (linecol_ - col) ;
             i < linepos_ ; ++i, ++col)
        {
            /* if this is the decimal point character, stop looking */
            if (linebuf_[i] == pending_tab_dp_)
                break;
        }

        /* 
         *   insert enough spaces to put the decimal point character in the
         *   defined tab's column; if the decimal point character is already
         *   past the tab's column, do nothing 
         */
        if (pending_tab_entry_->column_ > col)
            spaces = pending_tab_entry_->column_ - col;
        else
            spaces = 0;
        break;
    }

    /* insert the spaces into the buffer where the <TAB> appeared */
    if (spaces > 0)
    {
        /* 
         *   Calculate the index in the buffer of the insertion point.  To
         *   do this, start with linepos_, which the current output index in
         *   the buffer, and subtract the difference between linecol_ and
         *   the tab starting column, since this will give us the number of
         *   characters in the buffer since the tab insertion point. 
         */
        i = linepos_ - (linecol_ - pending_tab_start_);

        /* 
         *   open up the line buffer and line color buffer by the number of
         *   spaces we're adding 
         */
        memmove(linebuf_ + i + spaces, linebuf_ + i,
                (linepos_ - i + 1)*sizeof(linebuf_[0]));
        memmove(colorbuf_ + i + spaces, colorbuf_ + i,
                (linepos_ - i + 1)*sizeof(colorbuf_[0]));

        /* advance the line and column positions for the insertion */
        linecol_ += spaces;
        linepos_ += spaces;

        /* insert the spaces */
        for ( ; spaces != 0 ; --spaces, ++i)
        {
            /* insert a space of the same color active at the <TAB> */
            linebuf_[i] = ' ';
            colorbuf_[i] = pending_tab_color_;
        }
    }

    /* we've handled the pending tab, so we can forget about it */
    pending_tab_align_ = VMFMT_TAB_NONE;
}